

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quota_lessor.c
# Opt level: O1

void test_hard_lease(void)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  size_t available;
  ulong uVar9;
  ulong uVar10;
  ulong local_38;
  quota q;
  
  plan(0xc);
  _space(_stdout);
  printf("# *** %s ***\n","test_hard_lease");
  local_38 = 0x48000000000;
  do {
    uVar2 = (uint)local_38 + 0x400;
    if (0xfffffbff < (uint)local_38) {
LAB_0010210f:
      __assert_fail("new_used_in_units > used_in_units",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                    ,0x90,"ssize_t quota_use(struct quota *, size_t)");
    }
    iVar6 = 1;
    if (uVar2 <= (uint)(local_38 >> 0x20)) {
      local_38 = (ulong)uVar2 | local_38 & 0xffffffff00000000;
      LOCK();
      UNLOCK();
      iVar6 = 3;
    }
  } while (iVar6 == 0);
  if (iVar6 != 3) {
    uVar3 = 0xffffffffffffffff;
  }
  else {
    uVar3 = 0x100000;
  }
  bVar1 = iVar6 == 3;
  uVar5 = (ulong)bVar1 * 0x100000;
  uVar2 = 0;
  uVar9 = 0;
  if (0 < (long)uVar3) {
    uVar9 = uVar3;
  }
  _ok((uint)bVar1,"QUOTA_USE_MIN == quota_lease(&l, QUOTA_USE_MIN)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x49
      ,"lease 1Mb");
  _ok((uint)(uVar9 == uVar5),"0 == quota_available(&l)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x4a
      ,"available 0");
  _ok((uint)bVar1,"QUOTA_USE_MIN == quota_leased(&l)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x4b
      ,"leased 1Mb");
  _ok((uint)((uint)local_38 == 0x400),"QUOTA_USE_MIN == quota_used(&q)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x4c
      ,"source quota used");
  uVar10 = uVar5 + 0x100000;
  if ((long)uVar3 < (long)uVar10) {
    uVar4 = uVar10 - uVar9;
    uVar3 = 0x100000;
    if (0x100000 < uVar4) {
      uVar3 = uVar4;
    }
    do {
      if (uVar3 == 0) goto LAB_0010214d;
      do {
        uVar2 = (uint)local_38 + (int)(uVar3 + 0x3ff >> 10);
        if (uVar2 <= (uint)local_38) goto LAB_0010210f;
        iVar6 = 1;
        if (uVar2 <= (uint)(local_38 >> 0x20)) {
          local_38 = (ulong)uVar2 | local_38 & 0xffffffff00000000;
          LOCK();
          UNLOCK();
          iVar6 = 3;
        }
      } while (iVar6 == 0);
      if (iVar6 == 3) {
        uVar7 = uVar3 + 0x3ff & 0x3fffffffc00;
      }
      else {
        uVar7 = 0xffffffffffffffff;
      }
      uVar10 = uVar5 + 0x100000;
      uVar8 = 0;
      if (0 < (long)uVar7) {
        uVar8 = uVar7;
      }
      uVar9 = uVar9 + uVar8;
    } while (((long)uVar7 < 0) && (uVar3 = uVar3 >> 1, uVar10 = uVar5, uVar4 <= uVar3));
    uVar2 = (uint)(uVar7 >> 0x3f);
  }
  _ok(uVar2,"-1 == quota_lease(&l, QUOTA_USE_MIN)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x4e
      ,"lease too big");
  uVar3 = uVar10 + 0x400;
  uVar2 = 1;
  uVar5 = uVar3 - uVar9;
  if (uVar9 <= uVar3 && uVar5 != 0) {
    uVar4 = 0x100000;
    if (0x100000 < uVar5) {
      uVar4 = uVar5;
    }
    do {
      uVar7 = 0xffffffffffffffff;
      if (uVar4 < 0x3fffffffc01) {
        if (uVar4 == 0) {
LAB_0010214d:
          __assert_fail("size_in_units",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                        ,0x89,"ssize_t quota_use(struct quota *, size_t)");
        }
        do {
          uVar2 = (uint)local_38 + (int)(uVar4 + 0x3ff >> 10);
          if (uVar2 <= (uint)local_38) goto LAB_0010210f;
          iVar6 = 1;
          if (uVar2 <= (uint)(local_38 >> 0x20)) {
            local_38 = (ulong)uVar2 | local_38 & 0xffffffff00000000;
            LOCK();
            UNLOCK();
            iVar6 = 3;
          }
        } while (iVar6 == 0);
        if (iVar6 == 3) {
          uVar7 = uVar4 + 0x3ff & 0x3fffffffc00;
        }
      }
      uVar3 = uVar10 + 0x400;
      uVar8 = 0;
      if (0 < (long)uVar7) {
        uVar8 = uVar7;
      }
      uVar9 = uVar9 + uVar8;
    } while (((long)uVar7 < 0) && (uVar4 = uVar4 >> 1, uVar3 = uVar10, uVar5 <= uVar4));
    uVar2 = (uint)(-1 < (long)uVar7);
  }
  _ok(uVar2,"QUOTA_UNIT_SIZE == quota_lease(&l, QUOTA_UNIT_SIZE)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x50
      ,"hard lease");
  _ok((uint)(uVar3 == 0x100400),"QUOTA_UNIT_SIZE + QUOTA_USE_MIN == quota_leased(&l)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x52
      ,"leased changed");
  _ok((uint)(uVar9 - uVar3 == 0x1fc00),"QUOTA_USE_MIN / 8 - QUOTA_UNIT_SIZE == quota_available(&l)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x54
      ,"available the part of 1MB");
  _ok((uint)((uint)local_38 == 0x480),"quota_total == quota_used(&q)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x55
      ,"source quota fully used");
  if (0x1fffff < uVar9) {
    if (0x3fffffffbff < uVar9 - 0x100400) goto LAB_0010216c;
    uVar2 = (uint)(uVar9 - 0x100001 >> 10);
    if ((uint)local_38 < uVar2) goto LAB_0010212e;
    local_38._0_4_ = (uint)local_38 - uVar2;
    LOCK();
    UNLOCK();
    uVar9 = uVar9 - (uVar9 - 0x100001 & 0x3fffffffc00);
  }
  if (uVar9 != 0) {
    if ((uVar9 & 0x3ff) != 0) {
      __assert_fail("lessor->used % QUOTA_UNIT_SIZE == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota_lessor.h"
                    ,0x69,"void quota_lessor_destroy(struct quota_lessor *)");
    }
    if (0x3fffffffbff < uVar9) {
LAB_0010216c:
      __assert_fail("size < QUOTA_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                    ,0xa2,"ssize_t quota_release(struct quota *, size_t)");
    }
    uVar2 = (uint)(uVar9 >> 10);
    if ((uint)local_38 < uVar2) {
LAB_0010212e:
      __assert_fail("size_in_units <= used_in_units",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                    ,0xab,"ssize_t quota_release(struct quota *, size_t)");
    }
    local_38._0_4_ = (uint)local_38 - uVar2;
    LOCK();
    UNLOCK();
  }
  _ok(1,"0 == quota_available(&l)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x5a
      ,"lessor is empty");
  _ok(1,"0 == quota_leased(&l)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x5b
      ,"lessor is empty");
  _ok((uint)((uint)local_38 == 0),"0 == quota_used(&q)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x5c
      ,"sourcr quota is empty");
  _space(_stdout);
  printf("# *** %s: done ***\n","test_hard_lease");
  check_plan();
  return;
}

Assistant:

void
test_hard_lease()
{
	plan(12);
	header();

	struct quota q;
	size_t quota_total = QUOTA_USE_MIN + QUOTA_USE_MIN / 8;
	quota_init(&q, quota_total);
	struct quota_lessor l;
	quota_lessor_create(&l, &q);
	is(QUOTA_USE_MIN, quota_lease(&l, QUOTA_USE_MIN), "lease 1Mb");
	is(0, quota_available(&l), "available 0");
	is(QUOTA_USE_MIN, quota_leased(&l), "leased 1Mb");
	is(QUOTA_USE_MIN, quota_used(&q), "source quota used");

	is(-1, quota_lease(&l, QUOTA_USE_MIN), "lease too big");

	is(QUOTA_UNIT_SIZE, quota_lease(&l, QUOTA_UNIT_SIZE), "hard lease");

	is(QUOTA_UNIT_SIZE + QUOTA_USE_MIN, quota_leased(&l), "leased changed");
	is(QUOTA_USE_MIN / 8 - QUOTA_UNIT_SIZE, quota_available(&l),
	   "available the part of 1MB");
	is(quota_total, quota_used(&q), "source quota fully used");

	quota_end_lease(&l, quota_leased(&l));

	quota_lessor_destroy(&l);
	is(0, quota_available(&l), "lessor is empty");
	is(0, quota_leased(&l), "lessor is empty");
	is(0, quota_used(&q), "sourcr quota is empty");

	footer();
	check_plan();
}